

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O0

void test_uintwide_t_n_base::
     get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<96u,unsigned_short,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
               (uintwide_t<24U,_unsigned_char,_void,_false> *u_local,
               number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
               *u_boost,size_t count)

{
  anon_class_32_4_006e9c57 parallel_function;
  local_wide_integer_type lVar1;
  uint __s;
  random_engine_type *this;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  atomic_flag local_79;
  undefined8 uStack_78;
  atomic_flag rnd_lock;
  undefined8 local_64;
  undefined8 local_58;
  undefined8 local_48 [2];
  uniform_int_distribution<96U,_unsigned_short,_void,_false> local_38 [8];
  distribution_type distribution;
  size_t count_local;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *u_boost_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *u_local_local;
  
  count_local = (size_t)u_boost;
  u_boost_local =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        *)u_local;
  this = my_random_generator();
  __s = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::seed(this,__s);
  lVar1 = math::wide_integer::numeric_limits_uintwide_t_base<96U,_unsigned_short,_void,_false>::min
                    ();
  local_58 = CONCAT53(extraout_var,lVar1.values.super_array<unsigned_char,_3UL>.elems);
  local_48[0] = local_58;
  lVar1 = math::wide_integer::numeric_limits_uintwide_t_base<96U,_unsigned_short,_void,_false>::max
                    ();
  uStack_78 = CONCAT53(extraout_var_00,lVar1.values.super_array<unsigned_char,_3UL>.elems);
  local_64 = uStack_78;
  math::wide_integer::uniform_int_distribution<96U,_unsigned_short,_void,_false>::
  uniform_int_distribution(local_38,(result_type *)local_48,(result_type *)&local_64);
  std::atomic_flag::atomic_flag(&local_79,false);
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)&count_local;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)&u_boost_local;
  parallel_function.distribution = (distribution_type *)local_38;
  parallel_function.rnd_lock = &local_79;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_base::get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<96u,unsigned_short,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>(math::wide_integer::uintwide_t<96u,unsigned_short,void,false>*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<96u,96u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,unsigned_long)::_lambda(unsigned_long)_1_>
            (0,count,parallel_function);
  return;
}

Assistant:

static auto get_equal_random_test_values_boost_and_local_n(      OtherLocalUintType* u_local,
                                                                     OtherBoostUintType* u_boost,
                                                               const std::size_t         count) -> void
    {
      using other_local_uint_type = OtherLocalUintType;
      using other_boost_uint_type = OtherBoostUintType;

      my_random_generator().seed(util::util_pseudorandom_time_point_seed::value<typename random_engine_type::result_type>());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using distribution_type =
        WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #else
      using distribution_type =
        ::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #endif

      distribution_type distribution;

      std::atomic_flag rnd_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        count,
        [&u_local, &u_boost, &distribution, &rnd_lock](std::size_t i)
        {
          while(rnd_lock.test_and_set()) { ; }
          const other_local_uint_type a = distribution(my_random_generator());
          rnd_lock.clear();

          u_local[i] = a;                                                // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          u_boost[i] = other_boost_uint_type("0x" + hexlexical_cast(a)); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
        }
      );
    }